

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O1

void * readsf_new(t_floatarg fnchannels,t_floatarg fbufsize)

{
  uint uVar1;
  _binbuf *p_Var2;
  t_object *owner;
  t_symbol *s;
  _outlet *p_Var3;
  _clock *p_Var4;
  _glist *p_Var5;
  uint uVar6;
  int iVar7;
  int iVar8;
  
  uVar1 = (uint)fbufsize;
  iVar8 = 0x40;
  if ((int)fnchannels < 0x40) {
    iVar8 = (int)fnchannels;
  }
  iVar7 = 1;
  if (1 < iVar8) {
    iVar7 = iVar8;
  }
  if ((int)uVar1 < 1) {
    uVar6 = iVar7 << 0x12;
  }
  else {
    uVar6 = 0x40000;
    if ((0x3ffff < (int)uVar1) && (uVar6 = 0x1000000, (int)uVar1 < 0x1000000)) {
      uVar6 = uVar1;
    }
  }
  p_Var2 = (_binbuf *)getbytes((ulong)uVar6);
  if (p_Var2 == (_binbuf *)0x0) {
    owner = (t_object *)0x0;
  }
  else {
    owner = (t_object *)pd_new(readsf_class);
    iVar8 = iVar7;
    do {
      s = gensym("signal");
      outlet_new(owner,s);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
    *(int *)((long)&owner[1].te_outlet + 4) = iVar7;
    p_Var3 = outlet_new(owner,&s_bang);
    owner[0xc].te_outlet = p_Var3;
    pthread_mutex_init((pthread_mutex_t *)&owner[0xf].te_outlet,(pthread_mutexattr_t *)0x0);
    pthread_cond_init((pthread_cond_t *)&owner[0x10].te_binbuf,(pthread_condattr_t *)0x0);
    pthread_cond_init((pthread_cond_t *)&owner[0x11].te_binbuf,(pthread_condattr_t *)0x0);
    *(undefined4 *)&owner[0xc].te_binbuf = 0x80;
    *(undefined4 *)&owner[0xc].te_inlet = 0;
    p_Var4 = clock_new(owner,readsf_tick);
    owner[1].te_g.g_next = (_gobj *)p_Var4;
    p_Var5 = canvas_getcurrent();
    owner[1].te_g.g_pd = (t_pd)p_Var5;
    owner[0xd].te_binbuf = (_binbuf *)0x0;
    owner[0xd].te_outlet = (_outlet *)0x0;
    owner[0xd].te_inlet = (_inlet *)0x0;
    owner[0xd].te_xpix = 0;
    owner[0xd].te_ypix = 0;
    owner[0xd].te_width = 0;
    *(undefined2 *)&owner[0xd].field_0x2e = 0;
    owner[0xe].te_g.g_pd = (t_pd)0x0;
    owner[0xe].te_g.g_next = (_gobj *)0x0;
    *(undefined4 *)&owner[0xd].te_binbuf = 0xffffffff;
    owner[0xd].te_outlet = (_outlet *)0x0;
    owner[0xe].te_binbuf = (_binbuf *)0x7fffffffffffffff;
    *(undefined8 *)((long)&owner[0xd].te_inlet + 4) = 0x200000001;
    *(undefined4 *)((long)&owner[0xe].te_g.g_next + 4) = 2;
    owner[1].te_binbuf = p_Var2;
    *(uint *)&owner[1].te_outlet = uVar6;
    owner[0xc].te_xpix = 0;
    owner[0xc].te_ypix = 0;
    owner[0xe].te_xpix = 0;
    owner[0xe].te_ypix = 0;
    owner[0xe].te_inlet = (_inlet *)0x0;
    pthread_create((pthread_t *)&owner[0x12].te_binbuf,(pthread_attr_t *)0x0,readsf_child_main,owner
                  );
  }
  return owner;
}

Assistant:

static void *readsf_new(t_floatarg fnchannels, t_floatarg fbufsize)
{
    t_readsf *x;
    int nchannels = fnchannels, bufsize = fbufsize, i;
    char *buf;

    if (nchannels < 1)
        nchannels = 1;
    else if (nchannels > MAXSFCHANS)
        nchannels = MAXSFCHANS;
    if (bufsize <= 0) bufsize = DEFBUFPERCHAN * nchannels;
    else if (bufsize < MINBUFSIZE)
        bufsize = MINBUFSIZE;
    else if (bufsize > MAXBUFSIZE)
        bufsize = MAXBUFSIZE;
    buf = getbytes(bufsize);
    if (!buf) return 0;

    x = (t_readsf *)pd_new(readsf_class);

    for (i = 0; i < nchannels; i++)
        outlet_new(&x->x_obj, gensym("signal"));
    x->x_noutlets = nchannels;
    x->x_bangout = outlet_new(&x->x_obj, &s_bang);
    pthread_mutex_init(&x->x_mutex, 0);
    pthread_cond_init(&x->x_requestcondition, 0);
    pthread_cond_init(&x->x_answercondition, 0);
    x->x_vecsize = MAXVECSIZE;
    x->x_state = STATE_IDLE;
    x->x_clock = clock_new(x, (t_method)readsf_tick);
    x->x_canvas = canvas_getcurrent();
    soundfile_clear(&x->x_sf);
    x->x_sf.sf_bytespersample = 2;
    x->x_sf.sf_nchannels = 1;
    x->x_sf.sf_bytesperframe = 2;
    x->x_buf = buf;
    x->x_bufsize = bufsize;
    x->x_fifosize = x->x_fifohead = x->x_fifotail = x->x_requestcode = 0;
#ifdef PDINSTANCE
    x->x_pd_this = pd_this;
#endif
    pthread_create(&x->x_childthread, 0, readsf_child_main, x);
    return x;
}